

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::nonfinite_writer<char>>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,
          nonfinite_writer<char> *f)

{
  undefined2 uVar1;
  undefined8 *puVar2;
  long lVar3;
  byte bVar4;
  sign_t sVar5;
  char *in_RAX;
  char *unaff_RBX;
  char *pcVar6;
  ulong uVar7;
  fill_t<char> *fill;
  ulong uVar8;
  size_t n;
  undefined2 *puVar9;
  
  uVar8 = (ulong)specs->width;
  if ((long)uVar8 < 0) {
    assert_fail(unaff_RBX,0,in_RAX);
  }
  sVar5 = f->sign;
  uVar7 = 4 - (ulong)(sVar5 == none);
  n = uVar8 - uVar7;
  if (uVar8 < uVar7 || n == 0) {
    puVar2 = *(undefined8 **)this;
    lVar3 = puVar2[2];
    uVar7 = uVar7 + lVar3;
    if ((ulong)puVar2[3] < uVar7) {
      (**(code **)*puVar2)(puVar2,uVar7);
      sVar5 = f->sign;
    }
    puVar2[2] = uVar7;
    puVar9 = (undefined2 *)(lVar3 + puVar2[1]);
    if (sVar5 != none) {
      *(undefined1 *)puVar9 = *(undefined1 *)((long)&basic_data<void>::signs + (ulong)sVar5);
      puVar9 = (undefined2 *)((long)puVar9 + 1);
    }
    uVar1 = *(undefined2 *)f->str;
    *(char *)(puVar9 + 1) = f->str[2];
    *puVar9 = uVar1;
    return;
  }
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  uVar8 = uVar7 + lVar3 + (specs->fill).size_ * n;
  if ((ulong)puVar2[3] < uVar8) {
    (**(code **)*puVar2)(puVar2,uVar8);
  }
  puVar2[2] = uVar8;
  pcVar6 = (char *)(lVar3 + puVar2[1]);
  fill = &specs->fill;
  bVar4 = specs->field_0x9 & 0xf;
  if (bVar4 == 3) {
    pcVar6 = fill<char*,char>(pcVar6,n >> 1,fill);
    if ((ulong)f->sign != 0) {
      *pcVar6 = *(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
      pcVar6 = pcVar6 + 1;
    }
    uVar1 = *(undefined2 *)f->str;
    pcVar6[2] = f->str[2];
    *(undefined2 *)pcVar6 = uVar1;
    n = n - (n >> 1);
  }
  else {
    if (bVar4 == 2) {
      pcVar6 = fill<char*,char>(pcVar6,n,fill);
      if ((ulong)f->sign != 0) {
        *pcVar6 = *(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
        pcVar6 = pcVar6 + 1;
      }
      uVar1 = *(undefined2 *)f->str;
      pcVar6[2] = f->str[2];
      *(undefined2 *)pcVar6 = uVar1;
      return;
    }
    if ((ulong)f->sign != 0) {
      *pcVar6 = *(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
      pcVar6 = pcVar6 + 1;
    }
    uVar1 = *(undefined2 *)f->str;
    pcVar6[2] = f->str[2];
    *(undefined2 *)pcVar6 = uVar1;
  }
  fill<char*,char>(pcVar6 + 3,n,fill);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }